

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anonymizer.cpp
# Opt level: O3

void process_string_table(section *s,string *filename)

{
  size_type sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar3;
  string str;
  allocator<char> local_59;
  string *local_58;
  string local_50;
  
  local_58 = filename;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Info: processing string table section",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  iVar2 = (*s->_vptr_section[0x13])(s);
  if (1 < CONCAT44(extraout_var,iVar2)) {
    uVar3 = 1;
    do {
      iVar2 = (*s->_vptr_section[0x18])(s);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)(CONCAT44(extraout_var_00,iVar2) + uVar3),&local_59);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar2 == 0) {
        iVar2 = (*s->_vptr_section[0x17])(s);
        overwrite_data(local_58,CONCAT44(extraout_var_01,iVar2) + uVar3,&local_50);
      }
      sVar1 = local_50._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + sVar1 + 1;
      iVar2 = (*s->_vptr_section[0x13])(s);
    } while (uVar3 < CONCAT44(extraout_var_02,iVar2));
  }
  return;
}

Assistant:

void process_string_table( const section* s, const std::string& filename )
{
    std::cout << "Info: processing string table section" << std::endl;
    size_t index = 1;
    while ( index < s->get_size() ) {
        auto str = std::string( s->get_data() + index );
        // For the example purpose, we rename main function name only
        if ( str == "main" )
            overwrite_data( filename, s->get_offset() + index, str );
        index += str.length() + 1;
    }
}